

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O0

void __thiscall PatternGeneration::PatternGeneration(PatternGeneration *this)

{
  uniform_int_distribution<int> *this_00;
  shared_ptr<std::uniform_int_distribution<int>_> local_20;
  PatternGeneration *local_10;
  PatternGeneration *this_local;
  
  local_10 = this;
  std::shared_ptr<std::uniform_int_distribution<int>_>::shared_ptr(&this->dist);
  this_00 = (uniform_int_distribution<int> *)operator_new(8);
  std::uniform_int_distribution<int>::uniform_int_distribution(this_00);
  std::shared_ptr<std::uniform_int_distribution<int>>::
  shared_ptr<std::uniform_int_distribution<int>,void>
            ((shared_ptr<std::uniform_int_distribution<int>> *)&local_20,this_00);
  std::shared_ptr<std::uniform_int_distribution<int>_>::operator=(&this->dist,&local_20);
  std::shared_ptr<std::uniform_int_distribution<int>_>::~shared_ptr(&local_20);
  return;
}

Assistant:

PatternGeneration::PatternGeneration(){
    dist=std::shared_ptr<std::uniform_int_distribution<int> > (new std::uniform_int_distribution<int> ());
}